

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<ArenaVector<wasm::Expression*>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          ArenaVector<wasm::Expression_*> *list)

{
  ArenaVector<wasm::Expression_*> *size;
  Expression **ppEVar1;
  ArenaVector<wasm::Expression_*> *pAVar2;
  long lVar3;
  undefined1 local_48 [8];
  Iterator __begin0;
  
  size = (ArenaVector<wasm::Expression_*> *)
         (list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
         usedElements;
  pAVar2 = size;
  if (*(ArenaVector<wasm::Expression_*> **)(this + 0x10) < size) {
    ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,(size_t)size);
    pAVar2 = (ArenaVector<wasm::Expression_*> *)
             (list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
             usedElements;
  }
  __begin0.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  lVar3 = 0;
  local_48 = (undefined1  [8])list;
  __begin0.index = (size_t)size;
  while ((__begin0.parent != pAVar2 || (local_48 != (undefined1  [8])list))) {
    ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)local_48);
    *(Expression **)(*(long *)this + lVar3) = *ppEVar1;
    __begin0.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin0.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
    lVar3 = lVar3 + 8;
  }
  *(size_t *)(this + 8) = __begin0.index;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }